

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.h
# Opt level: O1

void __thiscall llvm::DelimitedScope<'[',_']'>::~DelimitedScope(DelimitedScope<_[_,__]_> *this)

{
  ScopedPrinter *this_00;
  char *pcVar1;
  raw_ostream *this_01;
  int iVar2;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  char *__n;
  
  this_00 = this->W;
  iVar2 = 1;
  if (1 < this_00->IndentLevel) {
    iVar2 = this_00->IndentLevel;
  }
  __n = (char *)(ulong)(iVar2 - 1U);
  this_00->IndentLevel = iVar2 - 1U;
  ScopedPrinter::printIndent(this_00);
  this_01 = this_00->OS;
  pcVar1 = this_01->OutBufCur;
  if (pcVar1 < this_01->OutBufEnd) {
    __n = pcVar1 + 1;
    this_01->OutBufCur = __n;
    *pcVar1 = ']';
    __buf_00 = __buf;
  }
  else {
    this_01 = (raw_ostream *)raw_ostream::write(this_01,0x5d,__buf,(size_t)__n);
    __buf_00 = extraout_RDX;
  }
  pcVar1 = this_01->OutBufCur;
  if (pcVar1 < this_01->OutBufEnd) {
    this_01->OutBufCur = pcVar1 + 1;
    *pcVar1 = '\n';
  }
  else {
    raw_ostream::write(this_01,10,__buf_00,(size_t)__n);
  }
  return;
}

Assistant:

~DelimitedScope() {
    W.unindent();
    W.startLine() << Close << '\n';
  }